

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  uint op;
  int iVar1;
  size_t sVar2;
  uint uVar3;
  long lVar4;
  int *piVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint a;
  uint pc;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  
  Tps = (timeval *)malloc(0x10);
  Tpf = (timeval *)malloc(0x10);
  Tzp = (void *)0x0;
  if (0xfffffffd < argc - 4U) {
    iVar6 = 0;
    iVar1 = 0;
    if (argc != 2) {
      __s = argv[2];
      sVar2 = strlen(__s);
      iVar8 = alloc::pos;
      lVar4 = (long)alloc::pos;
      uVar10 = (uint)sVar2;
      alloc::pos = uVar10 + alloc::pos + 1;
      if (0 < (int)uVar10) {
        uVar11 = 0;
        do {
          H[uVar11 + lVar4] = (int)__s[uVar11];
          uVar11 = uVar11 + 1;
        } while ((uVar10 & 0x7fffffff) != uVar11);
      }
      iVar6 = iVar8 * 4;
      iVar1 = uVar10 + 1;
      H[(int)(iVar8 + uVar10)] = 0;
    }
    R[1] = argc + -1;
    R[2] = 0;
    R[3] = iVar1;
    R[4] = iVar6;
    load(argv[1]);
    gettimeofday((timeval *)Tps,(__timezone_ptr_t)Tzp);
    uVar10 = 0;
switchD_00101644_caseD_6:
    do {
      pc = uVar10;
      uVar7 = C[pc];
      if (uVar7 < 0x40000000) {
        uVar3 = R[uVar7 & 0x1f];
      }
      else {
        uVar3 = ((uint)((uVar7 & 0xffff) < 0x8000) * 0x10000 + (uVar7 & 0xffff)) - 0x10000;
      }
      uVar9 = pc + 1;
      op = uVar7 >> 0x1a;
      R[0] = 0;
      uVar10 = uVar9;
    } while (0x3e < op);
    a = uVar7 >> 0x15 & 0x1f;
    uVar7 = uVar7 >> 0x10 & 0x1f;
    switch(op) {
    case 0:
    case 0x10:
      R[a] = uVar3 + R[uVar7];
      goto switchD_00101644_caseD_6;
    case 1:
    case 5:
    case 0x11:
    case 0x15:
      iVar1 = R[uVar7] - uVar3;
      break;
    case 2:
    case 0x12:
      uVar3 = uVar3 * R[uVar7];
      goto LAB_001016c6;
    case 3:
    case 0x13:
      iVar1 = R[uVar7] / (int)uVar3;
      break;
    case 4:
    case 0x14:
      R[a] = R[uVar7] % (int)uVar3;
    default:
      goto switchD_00101644_caseD_6;
    case 8:
    case 0x18:
      uVar3 = uVar3 | R[uVar7];
      goto LAB_001016c6;
    case 9:
    case 0x19:
      goto LAB_001016c2;
    case 10:
    case 0x1a:
      uVar3 = ~uVar3;
LAB_001016c2:
      uVar3 = uVar3 & R[uVar7];
      goto LAB_001016c6;
    case 0xb:
    case 0x1b:
      uVar3 = uVar3 ^ R[uVar7];
LAB_001016c6:
      R[a] = uVar3;
      goto switchD_00101644_caseD_6;
    case 0xc:
    case 0x1c:
      iVar1 = R[uVar7] << ((byte)uVar3 & 0x1f);
      break;
    case 0xe:
    case 0x1e:
      check(op,a,uVar7,uVar3,pc);
      goto switchD_00101644_caseD_6;
    case 0x20:
      iVar6 = R[uVar7] + uVar3;
      iVar1 = R[uVar7] + uVar3 + 3;
      if (-1 < iVar6) {
        iVar1 = iVar6;
      }
      piVar5 = M;
      goto LAB_0010184d;
    case 0x22:
      iVar1 = R[uVar7];
      iVar6 = iVar1 + 3;
      if (-1 < iVar1) {
        iVar6 = iVar1;
      }
      R[a] = M[iVar6 >> 2];
      R[uVar7] = R[uVar7] + uVar3;
      goto switchD_00101644_caseD_6;
    case 0x24:
      iVar1 = R[a];
      iVar8 = R[uVar7] + uVar3;
      iVar6 = R[uVar7] + uVar3 + 3;
      if (-1 < iVar8) {
        iVar6 = iVar8;
      }
      goto LAB_00101993;
    case 0x26:
      iVar8 = R[uVar7] - uVar3;
      R[uVar7] = iVar8;
      iVar1 = R[a];
      iVar6 = iVar8 + 3;
      if (-1 < iVar8) {
        iVar6 = iVar8;
      }
LAB_00101993:
      M[iVar6 >> 2] = iVar1;
      goto switchD_00101644_caseD_6;
    case 0x28:
      if (R[a] == 0) {
        uVar10 = uVar3 + pc;
      }
      goto switchD_00101644_caseD_6;
    case 0x29:
      uVar10 = uVar3 + pc;
      if (R[a] == 0) {
        uVar10 = uVar9;
      }
      goto switchD_00101644_caseD_6;
    case 0x2a:
      if (R[a] < 0) {
        uVar10 = uVar3 + pc;
      }
      goto switchD_00101644_caseD_6;
    case 0x2b:
      uVar10 = uVar3 + pc;
      if (R[a] < 0) {
        uVar10 = uVar9;
      }
      goto switchD_00101644_caseD_6;
    case 0x2c:
      if (R[a] < 1) {
        uVar10 = uVar3 + pc;
      }
      goto switchD_00101644_caseD_6;
    case 0x2d:
      if (0 < R[a]) {
        uVar10 = uVar3 + pc;
      }
      goto switchD_00101644_caseD_6;
    case 0x2e:
      R[0x1f] = uVar9 * 4;
      uVar10 = uVar3 + pc;
      goto switchD_00101644_caseD_6;
    case 0x31:
      uVar7 = R[(int)uVar3 % 0x20];
      uVar10 = uVar7 + 3;
      if (-1 < (int)uVar7) {
        uVar10 = uVar7;
      }
      uVar10 = (int)uVar10 >> 2;
      if ((uVar7 & 0xfffffffc) == 0x18) {
        main_cold_2();
        return 0;
      }
      goto switchD_00101644_caseD_6;
    case 0x32:
      uVar7 = uVar3 + 3;
      if (-1 < (int)uVar3) {
        uVar7 = uVar3;
      }
      iVar1 = alloc::pos << 2;
      alloc::pos = ((int)uVar7 >> 2) + alloc::pos;
      R[a] = iVar1;
      goto switchD_00101644_caseD_6;
    case 0x33:
      iVar6 = R[uVar7] + uVar3;
      iVar1 = R[uVar7] + uVar3 + 3;
      if (-1 < iVar6) {
        iVar1 = iVar6;
      }
      piVar5 = H;
LAB_0010184d:
      iVar1 = piVar5[iVar1 >> 2];
      break;
    case 0x34:
      iVar6 = R[uVar7] + uVar3;
      iVar1 = R[uVar7] + uVar3 + 3;
      if (-1 < iVar6) {
        iVar1 = iVar6;
      }
      H[iVar1 >> 2] = R[a];
      goto switchD_00101644_caseD_6;
    case 0x35:
      iVar1 = R[(int)uVar3];
      break;
    case 0x37:
      putchar((int)(char)R[(int)uVar3]);
      goto switchD_00101644_caseD_6;
    case 0x38:
      printf("%d");
      goto switchD_00101644_caseD_6;
    case 0x39:
      iVar6 = R[uVar7] + uVar3;
      iVar1 = R[uVar7] + uVar3 + 3;
      if (-1 < iVar6) {
        iVar1 = iVar6;
      }
      iVar6 = 1;
      goto LAB_00101914;
    case 0x3a:
      iVar6 = R[uVar7] + uVar3;
      iVar1 = R[uVar7] + uVar3 + 3;
      if (-1 < iVar6) {
        iVar1 = iVar6;
      }
      iVar6 = 0;
LAB_00101914:
      iVar1 = getFD(iVar1 >> 2,iVar6);
      break;
    case 0x3b:
      fclose((FILE *)fds[R[(int)uVar3]]);
      R[a] = 1;
      goto switchD_00101644_caseD_6;
    case 0x3c:
      iVar1 = feof((FILE *)fds[R[(int)uVar3]]);
      if (iVar1 == 0) {
        R[a] = 0;
      }
      else {
        R[a] = 1;
      }
      goto switchD_00101644_caseD_6;
    case 0x3d:
      iVar1 = fgetc((FILE *)fds[R[(int)uVar3]]);
      break;
    case 0x3e:
      goto switchD_00101644_caseD_3e;
    }
    R[a] = iVar1;
    goto switchD_00101644_caseD_6;
  }
LAB_00101a0e:
  main_cold_3();
  halt_baddata();
switchD_00101644_caseD_3e:
  main_cold_1();
  goto LAB_00101a0e;
}

Assistant:

int main(int argc, char **argv) {
	int op = 0;
	int a = 0;
	int b = 0;
	int c = 0;
	int length = 0;
	double counter = 0;
	unsigned int pc = 0; 
	unsigned int next = 0;
	Tps = (struct timeval *) malloc(sizeof(struct timeval));
	Tpf = (struct timeval *) malloc(sizeof(struct timeval));
	Tzp = 0;


	if ((argc < 2) || (argc > 3)) {
		fprintf(stderr,"usage: ./vm <vminput> <arg>\n");
		exit(-1);
	}
	
	if (argc == 2) {
		length = 0;
		c = 0;
	} else {
		length = strlen(argv[2])+1;
		c = alloc(length);
		copyParToMem(argv[2],c,length-1);

	}
	R[1] = argc - 1; // argc
	R[2] = 0; // isOnStack
	R[3] = length; // arglength
	R[4] = c; // adr

	load(argv[1]);
	gettimeofday (Tps, Tzp);
	while (1) {
		counter = counter + 1;
		next = pc + 1;
		op = C[pc] / 0x4000000 % 0x40;
		a = C[pc] / 0x200000 % 0x20;
		b = C[pc] / 0x10000 % 0x20;
		c = C[pc] % 0x10000;
		if (op < ADDI) { 
			c = R[c % 0x20]; 
		} else if (c >= 0x8000) { 
			c = c - 0x10000; 
		}
		R[0] = 0;
		
		switch (op) {
			case ADD: case ADDI: 
				R[a] = R[b] + c; 
				break;
			case MUL: case MULI: 
				R[a] = R[b] * c; 
				break;
			case SUBI: case SUB: case CMP: case CMPI: 
				R[a] = R[b] - c; 
				break;
			case BSR: 
				next = pc + c;
				R[31] = (pc + 1) * 4;
				break;
			case PSH: 
				R[b] = R[b] - c;
				M[R[b]/4] = R[a];
				break;
			case POP: 
				R[a] = M[R[b] / 4]; 
				R[b]=R[b]+c; 
				break;
			case STW: 
				M[(R[b] + c) / 4] = R[a];	
				break;
			case LDW: 
				R[a] = M[(R[b] + c) / 4]; 
				break;
			case DIV: case DIVI: 
				R[a] = R[b] / c; 
				break;
			case MOD: case MODI: 
				R[a] = R[b] % c; 
				break;
			case OR:  case ORI:  
				R[a] = R[b] | c; 
				break;
			case AND: case ANDI: 
				R[a] = R[b] & c; 
				break;
			case BIC: case BICI: 
				R[a] = R[b] & (~c); 
				break;
			case XOR: case XORI: 
				R[a] = R[b] ^ c; 
				break;
			case LSH: case LSHI: 
				R[a]=R[b] << c; 
				break;
			case BEQ: 
				if (R[a] == 0) { 
					next = pc + c; 
				} 
				break;
			case BNE: 
				if (R[a] != 0) { 
					next = pc + c; 
				} 
				break;
			case BLT: 
				if (R[a] < 0) { 
					next = pc + c; 
				} 
				break;
			case BGE: 
				if (R[a] >= 0) { 
					next = pc + c; 
				} 
				break;
			case BLE: 
				if (R[a] <= 0) { 
					next = pc + c; 
				} 
				break;
			case BGT: 
				if (R[a] > 0) { 
					next = pc + c; 
				} 
				break;
			case ALL: 
				R[a] = alloc(c/4); 
				break;
			case HSTW: 
				H[(R[b] + c) / 4] = R[a]; 
				break;
			case HLDW: 
				R[a] = H[(R[b] + c) / 4]; 
				break;
			case CHK: case CHKI: 
				check(op,a,b,c,pc); 
				break;
			case SFOPEN: 
				R[a] = getFD((R[b] + c) / 4,0); 
				break;
			case HFOPEN: 
				R[a] = getFD((R[b] + c) / 4,1); 
				break;
			case FCLOSE: 
				fclose(fds[R[c]]); 
				R[a] = 1;
				break;
			case FGETC: 
				R[a] = (int)fgetc(fds[R[c]]); 
				break;
			case FEOF: 
				if (feof(fds[R[c]]) != 0) { 
					R[a]=1;
				} else {
					R[a]=0;
				} 
				break;
			case WRI: 
				printf("%d",R[c]); 
				break;
			case WRC: 
				printf("%c",(char)R[c]); 
				break;
			case RET: 
				next = R[c % 32] / 4; 
				if (next == 6) {
					goto END;
				} 
				break;
			case HLT: 
				fprintf(stderr,"implicit exit with code %d\n", R[c]); 
				getchar();
				exit(-1);
				break;
			case ORD: 
				R[a] = (int)R[c]; 
				break;
		}
		pc = next;
	}
END:
	gettimeofday (Tpf, Tzp);
	fprintf(stderr,"Total VM execution time (usec): %ld\n",
              (Tpf->tv_sec-Tps->tv_sec)*1000000
             + Tpf->tv_usec-Tps->tv_usec);
	fprintf(stderr, "Executed instructions per second: %e\n", counter/(double)(Tpf->tv_sec-Tps->tv_sec));
	return 0;
}